

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O1

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  StrScanFmt SVar9;
  uint64_t uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  byte *pbVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  int iVar21;
  StrScanFmt SVar22;
  ulong uVar23;
  double dVar24;
  uint8_t xi [512];
  undefined8 local_240;
  byte local_238 [520];
  
  local_240 = o;
  if (dig == 0) {
    local_238[0] = 0;
    uVar12 = 0;
    dig = 0;
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    iVar13 = dig - 800;
    if (dig < 800) {
      iVar13 = 0;
    }
    uVar3 = 800;
    if (dig < 800) {
      uVar3 = dig;
    }
    uVar12 = iVar13 + ex10;
    if (((uVar12 ^ uVar3) & 1) != 0) {
      bVar7 = *p;
      if (bVar7 == 0x2e) {
        bVar7 = p[1];
        p = p + 1;
      }
      local_238[0] = bVar7 & 0xf;
      uVar3 = uVar3 - 1;
      p = p + 1;
      uVar23 = 1;
    }
    if (1 < uVar3) {
      uVar8 = uVar3 - 2;
      iVar13 = (int)uVar23;
      do {
        bVar7 = *p;
        if (bVar7 == 0x2e) {
          bVar7 = p[1];
          p = p + 1;
        }
        bVar19 = p[1];
        lVar14 = 1;
        if (bVar19 == 0x2e) {
          bVar19 = p[2];
          lVar14 = 2;
        }
        local_238[uVar23] = (bVar19 & 0xf) + (bVar7 & 0xf) * '\n';
        uVar23 = uVar23 + 1;
        p = p + lVar14 + 1;
        uVar3 = uVar3 - 2;
      } while ((uVar8 >> 1) + iVar13 + 1 != uVar23);
    }
    if (uVar3 != 0) {
      bVar7 = *p;
      if (bVar7 == 0x2e) {
        bVar7 = p[1];
        p = p + 1;
      }
      local_238[uVar23] = (bVar7 & 0xf) * '\n';
      uVar23 = uVar23 + 1;
      uVar12 = uVar12 - 1;
      dig = dig + 1;
      p = p + 1;
    }
    if (dig < 0x321) {
      if (dig < 0x13 && 0 < (int)uVar12) {
        iVar13 = 0x11 - dig;
        if (0x11 < dig) {
          iVar13 = 0;
        }
        uVar8 = iVar13 + 1U >> 1;
        uVar3 = 2;
        if ((int)uVar12 < 2) {
          uVar3 = uVar12;
        }
        uVar3 = (uVar12 - uVar3) + 1 >> 1;
        if (uVar8 < uVar3) {
          uVar3 = uVar8;
        }
        memset(local_238 + uVar23,0,(ulong)(uVar3 + 1));
        uVar23 = uVar23 + uVar3 + 1;
        uVar12 = (uVar12 + uVar3 * -2) - 2;
        dig = dig + uVar3 * 2 + 2;
      }
    }
    else {
      do {
        bVar7 = *p;
        if (bVar7 == 0x2e) {
          bVar7 = p[1];
          p = p + 1;
        }
        if (bVar7 != 0x30) {
          local_238[uVar23 - 1] = local_238[uVar23 - 1] | 1;
          break;
        }
        p = p + 1;
        dig = dig - 1;
      } while (800 < dig);
      dig = 800;
    }
  }
  if ((dig < 0x15) && (uVar12 == 0)) {
    uVar4 = (ulong)local_238[0];
    if (1 < (long)uVar23) {
      pbVar15 = local_238 + 1;
      do {
        uVar4 = (ulong)*pbVar15 + uVar4 * 100;
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 < local_238 + uVar23);
    }
    SVar22 = fmt;
    if ((dig != 0x14) || ((bVar2 = true, local_238[0] < 0x13 && ((long)uVar4 < 0)))) {
      if (fmt - STRSCAN_I64 < 2) {
        uVar5 = -uVar4;
        if (neg == 0) {
          uVar5 = uVar4;
        }
        local_240->u64 = uVar5;
        bVar2 = false;
      }
      else {
        iVar13 = (int)uVar4;
        if (fmt == STRSCAN_U32) {
LAB_001287b2:
          bVar2 = false;
          if (uVar4 >> 0x20 == 0) {
            iVar11 = -iVar13;
            if (neg == 0) {
              iVar11 = iVar13;
            }
            (local_240->field_4).i = iVar11;
            SVar22 = STRSCAN_U32;
            bVar2 = false;
          }
          else {
            SVar22 = STRSCAN_ERROR;
          }
        }
        else {
          SVar9 = fmt;
          if (fmt == STRSCAN_INT) {
            if (((opt & 2) == 0) && (uVar4 < (neg | 0x80000000))) {
              iVar11 = -iVar13;
              if (neg == 0) {
                iVar11 = iVar13;
              }
              (local_240->field_4).i = iVar11;
              SVar22 = STRSCAN_INT;
              fmt = STRSCAN_INT;
              bVar2 = false;
              goto LAB_001287e7;
            }
            SVar9 = STRSCAN_NUM;
            if ((opt & 0x10) != 0) goto LAB_001287b2;
          }
          fmt = SVar9;
          if ((long)uVar4 < 0) {
            bVar2 = true;
          }
          else {
            dVar24 = (double)(long)uVar4;
            if (neg != 0) {
              dVar24 = -dVar24;
            }
            local_240->n = dVar24;
            SVar22 = SVar9;
            bVar2 = false;
          }
        }
      }
    }
LAB_001287e7:
    if (!bVar2) {
      return SVar22;
    }
  }
  if (fmt == STRSCAN_INT) {
    fmt = STRSCAN_NUM;
    if ((opt & 0x10) == 0) {
LAB_00128814:
      iVar13 = ((int)uVar12 >> 1) + (int)uVar23;
      if (0x9b < iVar13) {
        uVar10 = 0xfff0000000000000;
        if (neg == 0) {
          uVar10 = 0x7ff0000000000000;
        }
        local_240->u64 = uVar10;
        return fmt;
      }
      if (iVar13 < -0xa3) {
        uVar10 = 0;
        if (neg != 0) {
          uVar10 = 0x8000000000000000;
        }
        local_240->u64 = uVar10;
        return fmt;
      }
      uVar4 = 0;
      iVar11 = 0;
      if (iVar13 < 9) {
        uVar4 = 0;
        do {
          uVar12 = (uint)uVar4;
          if ((int)((int)uVar23 - uVar12 & 0x1ff) <= iVar13) break;
          uVar8 = (int)uVar23 + 0x1ff;
          uVar3 = 0;
          do {
            uVar5 = uVar23;
            uVar17 = uVar8 & 0x1ff;
            uVar20 = (uint)local_238[uVar17] * 0x40 + uVar3;
            uVar3 = uVar20 / 100;
            local_238[uVar17] = (byte)(uVar20 % 100);
            uVar1 = (uint)uVar5;
            uVar23 = uVar5 & 0xffffffff;
            if ((uVar1 - 1 & 0x1ff) == uVar17 && uVar20 % 100 == 0) {
              uVar23 = (ulong)uVar17;
            }
            uVar8 = uVar17 - 1;
          } while (uVar17 != uVar12);
          uVar23 = uVar5 & 0xffffffff;
          if (99 < uVar20) {
            uVar12 = uVar12 - 1 & 0x1ff;
            uVar4 = (ulong)uVar12;
            uVar16 = (ulong)(uVar1 - 1 & 0x1ff);
            uVar23 = uVar16;
            if ((local_238[uVar16] != 0) && (uVar23 = uVar5 & 0xffffffff, uVar12 == uVar1)) {
              local_238[uVar1 + 0x1fe & 0x1ff] =
                   local_238[uVar1 + 0x1fe & 0x1ff] | local_238[uVar16];
              uVar23 = uVar16;
            }
            local_238[uVar4] = (byte)uVar3;
            iVar13 = iVar13 + 1;
          }
          iVar11 = iVar11 + -6;
        } while (iVar13 < 9);
      }
      uVar3 = (uint)uVar23;
      uVar12 = (uint)uVar4;
      while (9 < iVar13) {
        uVar16 = 0;
        uVar5 = uVar4;
        do {
          iVar18 = (int)uVar4;
          uVar3 = (uint)local_238[uVar4] + (int)uVar16;
          local_238[uVar4] = (byte)(uVar3 >> 6);
          uVar16 = (ulong)((uVar3 & 0x3f) * 100);
          iVar21 = (int)uVar5;
          bVar2 = (uVar3 & 0x3fc0) == 0;
          uVar6 = (ulong)(iVar21 + 1U & 0x1ff);
          if (iVar18 != iVar21 || !bVar2) {
            uVar6 = uVar5;
          }
          uVar12 = (uint)uVar6;
          iVar13 = iVar13 - (uint)(iVar18 == iVar21 && bVar2);
          uVar8 = iVar18 + 1U & 0x1ff;
          uVar4 = (ulong)uVar8;
          uVar5 = uVar6;
        } while (uVar8 != (uint)uVar23);
        if ((uVar3 & 0x3f) != 0) {
          do {
            uVar3 = (uint)uVar23;
            if (uVar12 == uVar3) {
              local_238[uVar3 - 1 & 0x1ff] = local_238[uVar3 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar23 & 0xffffffff] = (byte)(uVar16 >> 6);
            uVar23 = (ulong)(uVar3 + 1 & 0x1ff);
            uVar4 = uVar16 & 0x3c;
            uVar16 = (ulong)(((uint)uVar16 & 0x3c) * 100);
          } while (uVar4 != 0);
        }
        uVar3 = (uint)uVar23;
        iVar11 = iVar11 + 6;
        uVar4 = uVar6;
      }
      uVar23 = (ulong)local_238[uVar12];
      while( true ) {
        uVar12 = uVar12 + 1 & 0x1ff;
        if ((iVar13 < 2) || (uVar12 == uVar3)) break;
        uVar23 = (ulong)local_238[uVar12] + uVar23 * 100;
        iVar13 = iVar13 + -1;
      }
      if (uVar12 == uVar3) {
        if (0 < iVar13 + -1) {
          do {
            uVar23 = uVar23 * 100;
            iVar13 = iVar13 + -1;
          } while (1 < iVar13);
        }
      }
      else {
        uVar23 = uVar23 * 2;
        iVar11 = iVar11 + -1;
        do {
          if (local_238[uVar12] != 0) {
            uVar23 = uVar23 | 1;
            break;
          }
          uVar12 = uVar12 + 1 & 0x1ff;
        } while (uVar12 != uVar3);
      }
      strscan_double(uVar23,local_240,iVar11,neg);
      return fmt;
    }
  }
  else if (fmt < STRSCAN_U32) goto LAB_00128814;
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? ~x+1u : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}